

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Function<kj::MainBuilder::Validity_(kj::StringPtr)> * __thiscall
kj::Arena::
allocate<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>,kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>
          (Arena *this,Function<kj::MainBuilder::Validity_(kj::StringPtr)> *params)

{
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *location;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *params_00;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *result;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *params_local;
  Arena *this_local;
  
  location = (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)allocateBytes(this,0x10,8,true);
  params_00 = fwd<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>(params);
  ctor<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>,kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>
            (location,params_00);
  setDestructor(this,location,destroyObject<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>)
  ;
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}